

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeOpen(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCursor)

{
  sqlite3_vtab_cursor *psVar1;
  int iVar2;
  
  psVar1 = (sqlite3_vtab_cursor *)sqlite3_malloc64(0x128);
  if (psVar1 == (sqlite3_vtab_cursor *)0x0) {
    iVar2 = 7;
  }
  else {
    iVar2 = 0;
    memset(psVar1 + 1,0,0x120);
    psVar1->pVtab = pVTab;
    pVTab[3].nRef = pVTab[3].nRef + 1;
  }
  *ppCursor = psVar1;
  return iVar2;
}

Assistant:

static int rtreeOpen(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCursor){
  int rc = SQLITE_NOMEM;
  Rtree *pRtree = (Rtree *)pVTab;
  RtreeCursor *pCsr;

  pCsr = (RtreeCursor *)sqlite3_malloc64(sizeof(RtreeCursor));
  if( pCsr ){
    memset(pCsr, 0, sizeof(RtreeCursor));
    pCsr->base.pVtab = pVTab;
    rc = SQLITE_OK;
    pRtree->nCursor++;
  }
  *ppCursor = (sqlite3_vtab_cursor *)pCsr;

  return rc;
}